

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int stbrp_pack_rects(stbrp_context *context,stbrp_rect *rects,int num_rects)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  undefined1 auVar5 [16];
  stbrp_context *psVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  stbrp_node **ppsVar10;
  int iVar11;
  int *piVar12;
  long lVar13;
  ulong uVar14;
  stbrp_node *psVar15;
  stbrp_context *psVar16;
  uint uVar17;
  stbrp_node *in_R8;
  stbrp_node *psVar18;
  stbrp_rect *psVar19;
  stbrp_node *psVar20;
  stbrp_context *c;
  ulong __nmemb;
  size_t sVar21;
  int iVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  int waste;
  uint local_98;
  int local_94;
  stbrp_node *local_88;
  uint local_70;
  int local_60;
  int local_5c;
  ulong local_58;
  ulong local_50;
  stbrp_rect *local_48;
  ulong local_40;
  stbrp_rect *local_38;
  
  auVar5 = _DAT_0015b090;
  __nmemb = (ulong)(uint)num_rects;
  if (num_rects < 1) {
    __nmemb = (ulong)num_rects;
    qsort(rects,__nmemb,0x10,rect_height_compare);
  }
  else {
    lVar13 = __nmemb - 1;
    auVar24._8_4_ = (int)lVar13;
    auVar24._0_8_ = lVar13;
    auVar24._12_4_ = (int)((ulong)lVar13 >> 0x20);
    piVar12 = &rects[1].was_packed;
    uVar14 = 0;
    auVar24 = auVar24 ^ _DAT_0015b090;
    auVar25 = _DAT_0015b0b0;
    do {
      auVar26 = auVar25 ^ auVar5;
      if ((bool)(~(auVar26._4_4_ == auVar24._4_4_ && auVar24._0_4_ < auVar26._0_4_ ||
                  auVar24._4_4_ < auVar26._4_4_) & 1)) {
        piVar12[-4] = (int)uVar14;
      }
      if ((auVar26._12_4_ != auVar24._12_4_ || auVar26._8_4_ <= auVar24._8_4_) &&
          auVar26._12_4_ <= auVar24._12_4_) {
        *piVar12 = (int)uVar14 + 1;
      }
      uVar14 = uVar14 + 2;
      lVar13 = auVar25._8_8_;
      auVar25._0_8_ = auVar25._0_8_ + 2;
      auVar25._8_8_ = lVar13 + 2;
      piVar12 = piVar12 + 8;
    } while ((num_rects + 1U & 0xfffffffe) != uVar14);
    qsort(rects,__nmemb,0x10,rect_height_compare);
    if (0 < num_rects) {
      ppsVar10 = &context->active_head;
      sVar21 = 0;
      local_58 = __nmemb;
      local_50 = __nmemb;
      local_48 = rects;
      do {
        psVar19 = rects + sVar21;
        uVar1 = rects[sVar21].w;
        if ((uVar1 == 0) || (uVar2 = psVar19->h, uVar2 == 0)) {
          psVar19->x = 0;
          psVar19->y = 0;
        }
        else {
          iVar9 = context->width;
          iVar22 = (uint)uVar1 + context->align + -1;
          iVar22 = iVar22 - iVar22 % context->align;
          if (iVar22 <= iVar9) {
            iVar4 = context->height;
            local_70 = (uint)uVar2;
            if ((int)local_70 <= iVar4) {
              c = (stbrp_context *)*ppsVar10;
              uVar3 = (ushort)c->width;
              local_40 = (ulong)uVar1;
              local_38 = psVar19;
              if (iVar9 < (int)(iVar22 + (uint)uVar3)) {
                iVar11 = context->heuristic;
                local_88 = (stbrp_node *)0x0;
                local_98 = 0x40000000;
                local_94 = 0x40000000;
                uVar7 = 0;
              }
              else {
                local_98 = 0x40000000;
                local_88 = (stbrp_node *)0x0;
                local_94 = 0x40000000;
                psVar16 = c;
                psVar20 = (stbrp_node *)ppsVar10;
                uVar1 = uVar3;
                do {
                  uVar7 = stbrp__skyline_find_min_y
                                    (psVar16,(stbrp_node *)(ulong)uVar1,iVar22,(int)&local_5c,
                                     (int *)in_R8);
                  iVar11 = context->heuristic;
                  if (iVar11 == 0) {
                    if ((int)uVar7 < (int)local_98) {
                      local_98 = uVar7;
                      local_88 = psVar20;
                    }
                  }
                  else if (((int)(uVar2 + uVar7) <= iVar4) &&
                          (((int)uVar7 < (int)local_98 || (local_5c < local_94 && uVar7 == local_98)
                           ))) {
                    local_94 = local_5c;
                    local_98 = uVar7;
                    local_88 = psVar20;
                  }
                  psVar20 = (stbrp_node *)&psVar16->align;
                  uVar1 = (ushort)(*(stbrp_context **)&psVar16->align)->width;
                  psVar16 = *(stbrp_context **)&psVar16->align;
                } while ((int)(iVar22 + (uint)uVar1) <= iVar9);
                if (local_88 == (stbrp_node *)0x0) {
                  local_88 = (stbrp_node *)0x0;
                  uVar7 = 0;
                }
                else {
                  uVar7 = (uint)(*(stbrp_node **)local_88)->x;
                }
              }
              psVar16 = c;
              if (iVar11 == 1) {
                while (psVar20 = (stbrp_node *)ppsVar10, (int)(uint)uVar3 < iVar22) {
                  uVar3 = (ushort)(*(stbrp_context **)&psVar16->align)->width;
                  psVar16 = *(stbrp_context **)&psVar16->align;
                }
                do {
                  uVar17 = (uint)(ushort)psVar16->width - iVar22;
                  psVar18 = psVar20;
                  psVar6 = c;
                  do {
                    c = psVar6;
                    psVar20 = psVar18;
                    psVar18 = (stbrp_node *)&c->align;
                    psVar6 = *(stbrp_context **)&c->align;
                  } while ((int)(uint)(ushort)(*(stbrp_context **)&c->align)->width <= (int)uVar17);
                  uVar8 = stbrp__skyline_find_min_y
                                    (c,(stbrp_node *)(ulong)uVar17,iVar22,(int)&local_60,
                                     (int *)in_R8);
                  if ((((int)(uVar2 + uVar8) <= iVar4) && ((int)uVar8 <= (int)local_98)) &&
                     (((uVar8 < local_98 || (local_60 < local_94)) ||
                      ((local_60 == local_94 && ((int)uVar17 < (int)uVar7)))))) {
                    local_94 = local_60;
                    local_98 = uVar8;
                    local_88 = psVar20;
                    uVar7 = uVar17;
                  }
                  psVar16 = *(stbrp_context **)&psVar16->align;
                } while (psVar16 != (stbrp_context *)0x0);
              }
              in_R8 = local_88;
              psVar19 = local_38;
              rects = local_48;
              __nmemb = local_50;
              if (((local_88 != (stbrp_node *)0x0) && (iVar9 = uVar2 + local_98, iVar9 <= iVar4)) &&
                 (psVar20 = context->free_head, psVar20 != (stbrp_node *)0x0)) {
                psVar20->x = (stbrp_coord)uVar7;
                psVar20->y = (stbrp_coord)iVar9;
                context->free_head = psVar20->next;
                psVar18 = *(stbrp_node **)local_88;
                psVar15 = psVar18;
                if ((int)(uint)psVar18->x < (int)uVar7) {
                  psVar15 = psVar18->next;
                  local_88 = (stbrp_node *)&psVar18->next;
                }
                *(stbrp_node **)local_88 = psVar20;
                in_R8 = psVar15->next;
                iVar9 = uVar7 + (int)local_40;
                if (in_R8 != (stbrp_node *)0x0) {
                  do {
                    psVar18 = in_R8;
                    in_R8 = (stbrp_node *)(ulong)psVar18->x;
                    if (iVar9 < (int)(uint)psVar18->x) goto LAB_0010e23a;
                    psVar15->next = context->free_head;
                    context->free_head = psVar15;
                    psVar15 = psVar18;
                    in_R8 = psVar18->next;
                  } while (psVar18->next != (stbrp_node *)0x0);
                  in_R8 = (stbrp_node *)0x0;
                }
LAB_0010e23a:
                psVar20->next = psVar15;
                if ((int)(uint)psVar15->x < iVar9) {
                  psVar15->x = (stbrp_coord)iVar9;
                }
                local_38->x = (stbrp_coord)uVar7;
                local_38->y = (stbrp_coord)local_98;
                goto LAB_0010e229;
              }
            }
          }
          psVar19->x = 0xffff;
          psVar19->y = 0xffff;
        }
LAB_0010e229:
        sVar21 = sVar21 + 1;
        if (sVar21 == __nmemb) {
          qsort(rects,__nmemb,0x10,rect_original_order);
          if ((int)local_58 < 1) {
            return 1;
          }
          iVar9 = 1;
          lVar13 = 0;
          do {
            if (*(short *)((long)&rects->x + lVar13) == -1) {
              bVar23 = *(short *)((long)&rects->y + lVar13) != -1;
              *(uint *)((long)&rects->was_packed + lVar13) = (uint)bVar23;
              if (!bVar23) {
                iVar9 = 0;
              }
            }
            else {
              *(undefined4 *)((long)&rects->was_packed + lVar13) = 1;
            }
            lVar13 = lVar13 + 0x10;
          } while (__nmemb * 0x10 != lVar13);
          return iVar9;
        }
      } while( true );
    }
  }
  qsort(rects,__nmemb,0x10,rect_original_order);
  return 1;
}

Assistant:

STBRP_DEF int stbrp_pack_rects(stbrp_context *context, stbrp_rect *rects, int num_rects)
{
int i, all_rects_packed = 1;

/*  we use the 'was_packed' field internally to allow sorting/unsorting */
for (i=0; i < num_rects; ++i) {
rects[i].was_packed = i;
}

/*  sort according to heuristic */
STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_height_compare);

for (i=0; i < num_rects; ++i) {
if (rects[i].w == 0 || rects[i].h == 0) {
rects[i].x = rects[i].y = 0;  /*  empty rect needs no space */
} else {
stbrp__findresult fr = stbrp__skyline_pack_rectangle(context, rects[i].w, rects[i].h);
if (fr.prev_link) {
rects[i].x = (stbrp_coord) fr.x;
rects[i].y = (stbrp_coord) fr.y;
} else {
rects[i].x = rects[i].y = STBRP__MAXVAL;
}
}
}

/*  unsort */
STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_original_order);

/*  set was_packed flags and all_rects_packed status */
for (i=0; i < num_rects; ++i) {
rects[i].was_packed = !(rects[i].x == STBRP__MAXVAL && rects[i].y == STBRP__MAXVAL);
if (!rects[i].was_packed)
all_rects_packed = 0;
}

/*  return the all_rects_packed status */
return all_rects_packed;
}